

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredlines.cc
# Opt level: O3

void __thiscall gvr::ColoredLines::resizeLineList(ColoredLines *this,int ln)

{
  int iVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint *puVar6;
  
  uVar5 = 0xffffffffffffffff;
  if (-1 < ln * 2) {
    uVar5 = (ulong)(uint)(ln * 2) * 4;
  }
  puVar2 = (uint *)operator_new__(uVar5);
  iVar3 = this->n;
  if (ln <= this->n) {
    iVar3 = ln;
  }
  if (iVar3 < 1) {
    puVar6 = this->line;
    if (puVar6 == (uint *)0x0) goto LAB_00124be0;
  }
  else {
    puVar6 = this->line;
    iVar1 = iVar3 * 2 + 1;
    lVar4 = (ulong)(iVar3 * 2 - 2) + 1;
    do {
      puVar2[lVar4] = puVar6[lVar4];
      iVar1 = iVar1 + -1;
      lVar4 = lVar4 + -1;
    } while (1 < iVar1);
  }
  operator_delete__(puVar6);
LAB_00124be0:
  this->line = puVar2;
  this->n = ln;
  return;
}

Assistant:

void ColoredLines::resizeLineList(int ln)
{
  unsigned int *p=new unsigned int [(ln<<1)];

  for (int i=2*std::min(n, ln)-1; i>=0; i--)
  {
    p[i]=line[i];
  }

  delete [] line;

  line=p;
  n=ln;
}